

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O3

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::DelayedDestructor
          (DelayedDestructor<helics::Broker> *this,
          function<void_(std::shared_ptr<helics::Broker>_&)> *callFirst)

{
  undefined8 uVar1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  *(undefined8 *)&(this->callBeforeDeleteFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callBeforeDeleteFunction).super__Function_base._M_functor + 8) = 0;
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destructionLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->ElementsToBeDestroyed).
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->destructionLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->destructionLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->destructionLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->destructionLock).super___mutex_base._M_mutex + 8) = 0;
  (this->callBeforeDeleteFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callBeforeDeleteFunction)._M_invoker = callFirst->_M_invoker;
  if ((callFirst->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(callFirst->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->callBeforeDeleteFunction).super__Function_base._M_functor =
         *(undefined8 *)&(callFirst->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->callBeforeDeleteFunction).super__Function_base._M_functor + 8) =
         uVar1;
    (this->callBeforeDeleteFunction).super__Function_base._M_manager =
         (callFirst->super__Function_base)._M_manager;
    (callFirst->super__Function_base)._M_manager = (_Manager_type)0x0;
    callFirst->_M_invoker = (_Invoker_type)0x0;
  }
  TripWire::getLine();
  (this->tripDetect).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->tripDetect).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  return;
}

Assistant:

explicit DelayedDestructor(
        std::function<void(std::shared_ptr<X>& ptr)> callFirst):
        callBeforeDeleteFunction(std::move(callFirst))
    {
    }